

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Name> *
wasm::WATParser::maybeMemidx<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  bool *pbVar1;
  optional<unsigned_int> oVar2;
  undefined1 local_68 [8];
  optional<wasm::Name> id;
  
  oVar2 = Lexer::takeU<unsigned_int>(&ctx->in);
  if (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    Lexer::takeID((optional<wasm::Name> *)local_68,&ctx->in);
    if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\x01') {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20) = '\x01';
      return __return_storage_ptr__;
    }
    pbVar1 = &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_engaged;
    ParseDefsCtx::getMemoryFromName((Result<wasm::Name> *)pbVar1,ctx,_local_68);
    MaybeResult<wasm::Name>::MaybeResult<wasm::Name>
              (__return_storage_ptr__,(Result<wasm::Name> *)pbVar1);
  }
  else {
    pbVar1 = &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_engaged;
    ParseDefsCtx::getMemoryFromIdx
              ((Result<wasm::Name> *)pbVar1,ctx,
               oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload);
    MaybeResult<wasm::Name>::MaybeResult<wasm::Name>
              (__return_storage_ptr__,(Result<wasm::Name> *)pbVar1);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
             &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_engaged);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::MemoryIdxT> maybeMemidx(Ctx& ctx) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getMemoryFromIdx(*x);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getMemoryFromName(*id);
  }
  return {};
}